

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::XmlReporter::EndSection(XmlReporter *this,string *param_1,Counts *assertions)

{
  allocator<char> local_83;
  allocator<char> local_82;
  allocator<char> local_81;
  undefined1 local_80 [8];
  string local_78;
  string local_58;
  string local_38 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_38,"OverallResults",&local_81);
  XmlWriter::scopedElement((XmlWriter *)local_80,(string *)&this->m_xml);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"successes",&local_82);
  XmlWriter::writeAttribute<unsigned_long>((XmlWriter *)local_80,&local_58,&assertions->passed);
  std::__cxx11::string::string<std::allocator<char>>((string *)(local_80 + 8),"failures",&local_83);
  XmlWriter::writeAttribute<unsigned_long>
            ((XmlWriter *)local_80,(string *)(local_80 + 8),&assertions->failed);
  std::__cxx11::string::~string((string *)(local_80 + 8));
  std::__cxx11::string::~string((string *)&local_58);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_80);
  std::__cxx11::string::~string(local_38);
  XmlWriter::endElement(&this->m_xml);
  return;
}

Assistant:

virtual void EndSection( const std::string& /*sectionName*/, const Counts& assertions ) {
            m_xml.scopedElement( "OverallResults" )
                .writeAttribute( "successes", assertions.passed )
                .writeAttribute( "failures", assertions.failed );
            m_xml.endElement();
        }